

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_setfenv(lua_State *L,int idx)

{
  int iVar1;
  GCObject *pGVar2;
  TValue *pTVar3;
  TValue *i_o;
  int res;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  i_o._4_4_ = 1;
  pTVar3 = index2adr(L,idx);
  iVar1 = pTVar3->tt;
  if (iVar1 == 6) {
    (((pTVar3->value).gc)->h).array = (TValue *)L->top[-1].value;
  }
  else if (iVar1 == 7) {
    (((pTVar3->value).gc)->h).array = (TValue *)L->top[-1].value;
  }
  else if (iVar1 == 8) {
    pGVar2 = (pTVar3->value).gc;
    (pGVar2->th).l_gt.value = L->top[-1].value;
    (pGVar2->th).l_gt.tt = 5;
  }
  else {
    i_o._4_4_ = 0;
  }
  if (((i_o._4_4_ != 0) && ((((L->top[-1].value.gc)->gch).marked & 3) != 0)) &&
     (((((pTVar3->value).gc)->gch).marked & 4) != 0)) {
    luaC_barrierf(L,(pTVar3->value).gc,L->top[-1].value.gc);
  }
  L->top = L->top + -1;
  return i_o._4_4_;
}

Assistant:

LUA_API int lua_setfenv (lua_State *L, int idx) {
  StkId o;
  int res = 1;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2adr(L, idx);
  api_checkvalidindex(L, o);
  api_check(L, ttistable(L->top - 1));
  switch (ttype(o)) {
    case LUA_TFUNCTION:
      clvalue(o)->c.env = hvalue(L->top - 1);
      break;
    case LUA_TUSERDATA:
      uvalue(o)->env = hvalue(L->top - 1);
      break;
    case LUA_TTHREAD:
      sethvalue(L, gt(thvalue(o)), hvalue(L->top - 1));
      break;
    default:
      res = 0;
      break;
  }
  if (res) luaC_objbarrier(L, gcvalue(o), hvalue(L->top - 1));
  L->top--;
  lua_unlock(L);
  return res;
}